

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_crm_query_customer_label.cc
# Opt level: O0

void anon_unknown.dwarf_17368::Json2Type(Value *value,CrmQueryCustomerLabelResponseType *item)

{
  bool bVar1;
  Value *pVVar2;
  Json2Array<aliyun::CrmQueryCustomerLabelCustomerLabelType> local_59;
  string local_58;
  string local_38;
  CrmQueryCustomerLabelResponseType *local_18;
  CrmQueryCustomerLabelResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (CrmQueryCustomerLabelResponseType *)value;
  bVar1 = Json::Value::isMember(value,"Success");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Success");
    bVar1 = Json::Value::asBool(pVVar2);
    local_18->success = bVar1;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Code");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Code");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->code,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Message");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Message");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->message,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Data");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Data");
    bVar1 = Json::Value::isMember(pVVar2,"CustomerLabel");
    if (bVar1) {
      pVVar2 = Json::Value::operator[]((Value *)item_local,"Data");
      pVVar2 = Json::Value::operator[](pVVar2,"CustomerLabel");
      Json2Array<aliyun::CrmQueryCustomerLabelCustomerLabelType>::Json2Array
                (&local_59,pVVar2,&local_18->data);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, CrmQueryCustomerLabelResponseType* item) {
  if(value.isMember("Success")) {
    item->success = value["Success"].asBool();
  }
  if(value.isMember("Code")) {
    item->code = value["Code"].asString();
  }
  if(value.isMember("Message")) {
    item->message = value["Message"].asString();
  }
  if(value.isMember("Data") && value["Data"].isMember("CustomerLabel")) {
    Json2Array<CrmQueryCustomerLabelCustomerLabelType>(value["Data"]["CustomerLabel"], &item->data);
  }
}